

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak.cpp
# Opt level: O0

void xmrig::keccak(uint8_t *in,int inlen,uint8_t *md,int mdlen)

{
  long lVar1;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int rsizw;
  int rsiz;
  int i;
  uint8_t temp [144];
  state_t st;
  int local_188;
  int local_17c;
  ulong local_178 [18];
  uint64_t local_e8 [25];
  int local_1c;
  void *local_18;
  int local_c;
  void *local_8;
  
  if (in_ECX == 200) {
    local_188 = 0x88;
  }
  else {
    local_188 = in_ECX * -2 + 200;
  }
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_e8,0,200);
  for (; local_188 <= local_c; local_c = local_c - local_188) {
    for (local_17c = 0; local_17c < local_188 / 8; local_17c = local_17c + 1) {
      local_e8[local_17c] = *(ulong *)((long)local_8 + (long)local_17c * 8) ^ local_e8[local_17c];
    }
    keccakf(local_e8,0x18);
    local_8 = (void *)((long)local_8 + (long)local_188);
  }
  memcpy(local_178,local_8,(long)local_c);
  lVar1 = (long)local_c;
  local_c = local_c + 1;
  *(undefined1 *)((long)local_178 + lVar1) = 1;
  memset((void *)((long)local_178 + (long)local_c),0,(long)(local_188 - local_c));
  *(byte *)((long)local_178 + (long)(local_188 + -1)) =
       *(byte *)((long)local_178 + (long)(local_188 + -1)) | 0x80;
  for (local_17c = 0; local_17c < local_188 / 8; local_17c = local_17c + 1) {
    local_e8[local_17c] = local_178[local_17c] ^ local_e8[local_17c];
  }
  keccakf(local_e8,0x18);
  memcpy(local_18,local_e8,(long)local_1c);
  return;
}

Assistant:

void xmrig::keccak(const uint8_t *in, int inlen, uint8_t *md, int mdlen)
{
    state_t st;
    uint8_t temp[144];
    int i, rsiz, rsizw;

    rsiz = sizeof(state_t) == mdlen ? HASH_DATA_AREA : 200 - 2 * mdlen;
    rsizw = rsiz / 8;
    
    memset(st, 0, sizeof(st));

    for ( ; inlen >= rsiz; inlen -= rsiz, in += rsiz) {
        for (i = 0; i < rsizw; i++) {
            st[i] ^= ((uint64_t *) in)[i];
        }

        xmrig::keccakf(st, KECCAK_ROUNDS);
    }

    // last block and padding
    memcpy(temp, in, inlen);
    temp[inlen++] = 1;
    memset(temp + inlen, 0, rsiz - inlen);
    temp[rsiz - 1] |= 0x80;

    for (i = 0; i < rsizw; i++) {
        st[i] ^= ((uint64_t *) temp)[i];
    }

    keccakf(st, KECCAK_ROUNDS);

    memcpy(md, st, mdlen);
}